

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualPrecision3_Test::Equality_unitsEqualPrecision3_Test
          (Equality_unitsEqualPrecision3_Test *this)

{
  Equality_unitsEqualPrecision3_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_unitsEqualPrecision3_Test_00149c18;
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision3)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 2.000000000000000444089209850062616169452667236328125);
    u2->addUnit("second", 2.0);

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}